

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O3

void rand_pos(int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int quad [4];
  int local_48 [6];
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  if (0 < n) {
    uVar4 = 0;
    do {
      iVar1 = rand();
      iVar1 = iVar1 % 4;
      while (local_48[iVar1] != 0) {
        iVar1 = iVar1 + 1;
        if (iVar1 == 4) {
          iVar1 = 0;
        }
      }
      local_48[iVar1] = 1;
      iVar2 = rand();
      iVar2 = (iVar1 - (iVar1 - (iVar1 >> 0x1f) & 0x1ffffffeU)) * 5000 + iVar2 % 5000;
      robots[uVar4].x = iVar2;
      robots[uVar4].org_x = iVar2;
      iVar3 = rand();
      iVar2 = iVar3 % 5000 + 5000;
      if (1 < iVar1) {
        iVar2 = iVar3 % 5000;
      }
      robots[uVar4].y = iVar2;
      robots[uVar4].org_y = iVar2;
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)n);
  }
  return;
}

Assistant:

void rand_pos(int n)
{
	int i, k;
	int quad[4];

	for (i = 0; i < 4; i++) {
		quad[i] = 0;
	}

	/* get a new quadrant */
	for (i = 0; i < n; i++) {
		k = rand() % 4;
		if (quad[k] == 0)
			quad[k] = 1;
		else {
			while (quad[k] != 0) {
				if (++k == 4)
					k = 0;
			}
			quad[k] = 1;
		}
		robots[i].org_x = robots[i].x =
			(rand() % (MAX_X * CLICK / 2)) + ((MAX_X * CLICK / 2) * (k % 2));
		robots[i].org_y = robots[i].y =
			(rand() % (MAX_Y * CLICK / 2)) + ((MAX_Y * CLICK / 2) * (k<2));
	}
}